

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

ostream * toml::operator<<(ostream *os,basic_value<toml::type_config> *v)

{
  spec s;
  string_type local_60;
  semantic_version local_40;
  spec local_30;
  
  local_40.major = 1;
  local_40.minor = 0;
  local_40.patch = 0;
  spec::spec(&local_30,&local_40);
  s.version.patch = local_30.version.patch;
  s.v1_1_0_allow_control_characters_in_comments =
       local_30.v1_1_0_allow_control_characters_in_comments;
  s.v1_1_0_allow_newlines_in_inline_tables = local_30.v1_1_0_allow_newlines_in_inline_tables;
  s.v1_1_0_allow_trailing_comma_in_inline_tables =
       local_30.v1_1_0_allow_trailing_comma_in_inline_tables;
  s.v1_1_0_allow_non_english_in_bare_keys = local_30.v1_1_0_allow_non_english_in_bare_keys;
  s.version.major = local_30.version.major;
  s.version.minor = local_30.version.minor;
  s.v1_1_0_add_escape_sequence_e = local_30.v1_1_0_add_escape_sequence_e;
  s.v1_1_0_add_escape_sequence_x = local_30.v1_1_0_add_escape_sequence_x;
  s.v1_1_0_make_seconds_optional = local_30.v1_1_0_make_seconds_optional;
  s.ext_hex_float = local_30.ext_hex_float;
  s.ext_num_suffix = local_30.ext_num_suffix;
  s.ext_null_value = local_30.ext_null_value;
  s._22_2_ = local_30._22_2_;
  format<toml::type_config>(&local_60,v,s);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_60._M_dataplus._M_p,local_60._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const basic_value<TC>& v)
{
    os << format(v);
    return os;
}